

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRackpinion.cpp
# Opt level: O2

void __thiscall chrono::ChLinkRackpinion::UpdateTime(ChLinkRackpinion *this,double mytime)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChVector<double> v;
  ChVector<double> abs_Dz;
  ChVector<double> abs_Dy;
  ChVector<double> abs_Dx;
  ChMatrix33<double> mrot;
  ChVector<double> abs_Dr;
  ChVector<double> abs_Dpin;
  ChFrame<double> abs_contact;
  ChFrame<double> mrotframe;
  ChFrame<double> abs_pinion;
  ChFrame<double> abs_rack;
  undefined1 local_3a8 [16];
  double local_398;
  undefined1 local_388 [16];
  double local_378;
  undefined1 local_368 [16];
  double local_358;
  undefined1 local_348 [16];
  double local_338;
  ChVector<double> local_328;
  ChMatrix33<double> local_310;
  ChVector<double> local_2c8;
  ChVector<double> local_2b0;
  ChFrame<double> local_298;
  ChFrame<double> local_208;
  ChFrame<double> local_178;
  ChFrame<double> local_f0;
  undefined1 local_68 [64];
  double local_28;
  
  ChLink::UpdateTime((ChLink *)this,mytime);
  local_f0._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_298.coord.pos.m_data[1] = 0.0;
  local_f0.coord.pos.m_data[2] = 0.0;
  local_298._vptr_ChFrame = (_func_int **)0x0;
  local_298.coord.pos.m_data[0] = 0.0;
  local_f0.coord.pos.m_data[0] = 0.0;
  local_f0.coord.pos.m_data[1] = 0.0;
  ChFrame<double>::ChFrame
            (&local_178,(ChVector<double> *)&local_298,(ChQuaternion<double> *)&local_f0);
  local_298._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_298.coord.pos.m_data[2] = 0.0;
  local_208.coord.pos.m_data[1] = 0.0;
  local_298.coord.pos.m_data[0] = 0.0;
  local_298.coord.pos.m_data[1] = 0.0;
  local_208._vptr_ChFrame = (_func_int **)0x0;
  local_208.coord.pos.m_data[0] = 0.0;
  ChFrame<double>::ChFrame
            (&local_f0,(ChVector<double> *)&local_208,(ChQuaternion<double> *)&local_298);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1,
             &this->local_pinion,&local_178);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2,
             &this->local_rack,&local_f0);
  dVar14 = local_178.coord.pos.m_data[0] - local_f0.coord.pos.m_data[0];
  local_338 = 0.0;
  local_378 = 0.0;
  dVar3 = local_178.coord.pos.m_data[1] - local_f0.coord.pos.m_data[1];
  local_298._vptr_ChFrame =
       (_func_int **)
       local_f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_298.coord.pos.m_data[0] =
       local_f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dVar4 = local_178.coord.pos.m_data[2] - local_f0.coord.pos.m_data[2];
  local_298.coord.pos.m_data[1] =
       local_f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_2b0.m_data[0] =
       local_178.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_2b0.m_data[1] =
       local_178.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_358 = 0.0;
  local_2b0.m_data[2] =
       local_178.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_388 = ZEXT816(0) << 0x20;
  local_368 = local_388;
  local_348 = local_388;
  ChVector<double>::DirToDxDyDz
            (&local_2b0,(ChVector<double> *)local_388,(ChVector<double> *)local_348,
             (ChVector<double> *)local_368,(ChVector<double> *)&local_298);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar14;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_358;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar4;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = dVar3 * (double)local_368._8_8_;
  auVar6 = vfmadd231sd_fma(auVar6,local_368,auVar16);
  auVar6 = vfmadd231sd_fma(auVar6,auVar11,auVar17);
  dVar14 = auVar6._0_8_;
  local_398 = local_358 * dVar14;
  local_3a8._0_8_ = local_368._0_8_ * dVar14;
  local_3a8._8_8_ = (double)local_368._8_8_ * dVar14;
  auVar6 = vshufpd_avx(local_3a8,local_3a8,1);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar3 * auVar6._0_8_;
  auVar6 = vfmadd231sd_fma(auVar15,local_3a8,auVar16);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = local_398;
  auVar6 = vfmadd231sd_fma(auVar6,auVar12,auVar17);
  if (0.0 < auVar6._0_8_) {
    auVar13._0_8_ = -local_398;
    auVar13._8_8_ = 0x8000000000000000;
    local_3a8._8_8_ = -(double)local_3a8._8_8_;
    local_3a8._0_8_ = -(double)local_3a8._0_8_;
    local_398 = (double)vmovlpd_avx(auVar13);
  }
  ChVector<double>::GetNormalized(&local_2c8,(ChVector<double> *)local_3a8);
  auVar8 = _DAT_00e83400;
  dVar14 = this->R;
  (this->contact_pt).m_data[0] = dVar14 * local_2c8.m_data[0] + local_178.coord.pos.m_data[0];
  (this->contact_pt).m_data[1] = dVar14 * local_2c8.m_data[1] + local_178.coord.pos.m_data[1];
  (this->contact_pt).m_data[2] = dVar14 * local_2c8.m_data[2] + local_178.coord.pos.m_data[2];
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_338;
  auVar7 = vbroadcastsd_avx512f(auVar1);
  auVar8 = vpermi2pd_avx512f(auVar8,ZEXT2464(CONCAT816(auVar7._16_8_,local_348)),ZEXT1664(local_368)
                            );
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_358;
  auVar7 = vbroadcastsd_avx512f(auVar2);
  auVar9._0_40_ = auVar8._0_40_;
  auVar9._40_8_ = auVar7._40_8_;
  auVar9._48_8_ = auVar8._48_8_;
  auVar9._56_8_ = auVar8._56_8_;
  local_68 = vpermi2pd_avx512f(_DAT_00e83440,auVar9,ZEXT1664(local_388));
  local_28 = local_378;
  ChFrame<double>::ChFrame(&local_298,&this->contact_pt,(ChMatrix33<double> *)local_68);
  local_208.coord.pos.m_data[0] = this->beta;
  local_208._vptr_ChFrame = (_func_int **)0x0;
  local_208.coord.pos.m_data[1] = 0.0;
  ChMatrix33<double>::Set_A_Rxyz(&local_310,(ChVector<double> *)&local_208);
  ChFrame<double>::ChFrame(&local_208,(ChVector<double> *)&VNULL,&local_310);
  ChFrame<double>::ConcatenatePostTransformation(&local_298,&local_208);
  if (0.0 <= (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.react_force.m_data[0]) {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = this->alpha;
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar6 = vxorpd_avx512vl(auVar10,auVar5);
    local_328.m_data[2] = (double)vmovlpd_avx(auVar6);
  }
  else {
    local_328.m_data[2] = this->alpha;
  }
  local_328.m_data[1] = 0.0;
  local_328.m_data[0] = 0.0;
  ChMatrix33<double>::Set_A_Rxyz(&local_310,&local_328);
  ChFrame<double>::SetRot(&local_208,&local_310);
  ChFrame<double>::ConcatenatePostTransformation(&local_298,&local_208);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1,
             &local_298,&(this->super_ChLinkMateGeneric).frame1);
  ChFrame<double>::TransformParentToLocal
            ((ChFrame<double> *)(this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body2,
             &local_298,&(this->super_ChLinkMateGeneric).frame2);
  return;
}

Assistant:

void ChLinkRackpinion::UpdateTime(double mytime) {
    // First, inherit to parent class
    ChLinkMateGeneric::UpdateTime(mytime);

    ChFrame<double> abs_pinion;
    ChFrame<double> abs_rack;

    ((ChFrame<double>*)Body1)->TransformLocalToParent(local_pinion, abs_pinion);
    ((ChFrame<double>*)Body2)->TransformLocalToParent(local_rack, abs_rack);

    ChVector<> abs_distpr = abs_pinion.GetPos() - abs_rack.GetPos();
    ChVector<> abs_Dpin = abs_pinion.GetA().Get_A_Zaxis();
    ChVector<> abs_Dx;
    ChVector<> abs_Dy;
    ChVector<> abs_Dz;
    abs_Dpin.DirToDxDyDz(abs_Dz, abs_Dx, abs_Dy,
                         abs_rack.GetA().Get_A_Xaxis());  // with z as pinion shaft and x as suggested rack X dir

    /*
    GetLog() << "abs_distpr " << abs_distpr << "\n";
    GetLog() << "abs_rack Xaxis()" << abs_rack.GetA()->Get_A_Xaxis() << "\n";
    GetLog() << "abs_Dpin " << abs_Dpin << "\n";
    GetLog() << "abs_Dx " << abs_Dx << "\n";
    */

    ChVector<> abs_Ro = abs_Dy * Vdot(abs_Dy, abs_distpr);

    if (Vdot(abs_Ro, abs_distpr) > 0)
        abs_Ro = -abs_Ro;

    ChVector<> abs_Dr = abs_Ro.GetNormalized();
    ChVector<> abs_R = abs_Dr * this->GetPinionRadius();
    this->contact_pt = abs_pinion.GetPos() + abs_R;

    // Absolute frame of link reference
    ChMatrix33<> ma1(abs_Dx, abs_Dy, abs_Dz);
    ChFrame<> abs_contact(this->contact_pt, ma1);

    ChMatrix33<> mrot;

    // rotate link frame on its Y because of beta
    mrot.Set_A_Rxyz(ChVector<>(0, this->beta, 0));
    ChFrame<> mrotframe(VNULL, mrot);
    abs_contact.ConcatenatePostTransformation(mrotframe);  // or: abs_contact *= mrotframe;

    // rotate link frame on its Z because of alpha
    if (this->react_force.x() < 0)
        mrot.Set_A_Rxyz(ChVector<>(0, 0, this->alpha));
    else
        mrot.Set_A_Rxyz(ChVector<>(0, 0, -this->alpha));
    mrotframe.SetRot(mrot);
    abs_contact.ConcatenatePostTransformation(mrotframe);  // or: abs_contact *= mrotframe;

    // Set the link frame 'abs_contact' to relative frames to the two connected ChBodyFrame
    ((ChFrame<double>*)Body1)->TransformParentToLocal(abs_contact, this->frame1);
    ((ChFrame<double>*)Body2)->TransformParentToLocal(abs_contact, this->frame2);
}